

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  cmMakefile *mf;
  cmGeneratorTarget *pcVar1;
  cmake *pcVar2;
  cmMakefile *this_00;
  cmSourceFile *this_01;
  bool bVar3;
  __type _Var4;
  TargetType TVar5;
  int iVar6;
  cmGlobalGenerator *pcVar7;
  string *psVar8;
  long lVar9;
  cmSystemTools *this_02;
  _Base_ptr p_Var10;
  char *pcVar11;
  char *__s2;
  mapped_type *pmVar12;
  iterator iVar13;
  mapped_type *this_03;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  pointer ppcVar14;
  _Base_ptr p_Var15;
  _Alloc_hider _Var16;
  pointer ppcVar17;
  pointer pbVar18;
  pointer ppcVar19;
  pointer pbVar20;
  bool bVar21;
  all_files_map_t allFiles;
  allocator local_44a;
  allocator local_449;
  string fastTarget;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  cmXMLWriter xml;
  string make;
  string compiler;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets_1;
  string makeArgs;
  Tree tree;
  cmGeneratedFileStream fout;
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  __last._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,(filename->_M_dataplus)._M_p,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    tree.path._M_dataplus._M_p = (pointer)&tree.path.field_2;
    tree.path._M_string_length = 0;
    tree.path.field_2._M_local_buf[0] = '\0';
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar7 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var10 = (pcVar7->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var10 != &(pcVar7->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      compiler._M_dataplus._M_p = (pointer)0x0;
      compiler._M_string_length = 0;
      compiler.field_2._M_allocated_capacity = 0;
      for (p_Var15 = *(_Base_ptr *)(p_Var10 + 2); _Var16._M_p = compiler._M_dataplus._M_p,
          p_Var15 != p_Var10[2]._M_parent; p_Var15 = (_Base_ptr)&p_Var15->_M_parent) {
        __last._M_current =
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (*(long *)(*(long *)p_Var15 + 0x28) + 0x168);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&compiler,
                   (const_iterator)compiler._M_string_length,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(*(long *)p_Var15 + 0x28) + 0x160),__last);
      }
      for (; _Var16._M_p != (pointer)compiler._M_string_length;
          _Var16._M_p = (pointer)((string *)_Var16._M_p + 0x20)) {
        psVar8 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
        lVar9 = std::__cxx11::string::find((string *)_Var16._M_p,(ulong)psVar8);
        if (lVar9 != 0) {
          this_02 = (cmSystemTools *)
                    cmLocalGenerator::GetSourceDirectory
                              ((cmLocalGenerator *)**(undefined8 **)(p_Var10 + 2));
          cmSystemTools::RelativePath_abi_cxx11_
                    ((string *)&xml,this_02,*(char **)_Var16._M_p,(char *)__last._M_current);
          make._M_dataplus._M_p = (pointer)0x0;
          make._M_string_length = 0;
          make.field_2._M_allocated_capacity = 0;
          cmsys::SystemTools::SplitPath
                    ((string *)&xml,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&make,false);
          std::__cxx11::string::string((string *)&allFiles,(string *)(make._M_string_length - 0x20))
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&make,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (make._M_string_length - 0x20),(const_iterator)make._M_string_length);
          if ((make._M_dataplus._M_p != (pointer)make._M_string_length) &&
             (lVar9 = std::__cxx11::string::find((char *)&xml,0x5b666a), lVar9 == -1)) {
            __last._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&allFiles;
            Tree::InsertPath(&tree,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&make,1,(string *)&allFiles);
          }
          std::__cxx11::string::~string((string *)&allFiles);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&make);
          std::__cxx11::string::~string((string *)&xml);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&compiler);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      pcVar7 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    }
    GetCBCompilerId_abi_cxx11_(&compiler,this,mf);
    std::__cxx11::string::string((string *)&xml,"CMAKE_MAKE_PROGRAM",(allocator *)&allFiles);
    pcVar11 = cmMakefile::GetRequiredDefinition(mf,(string *)&xml);
    std::__cxx11::string::string((string *)&make,pcVar11,(allocator *)&makeArgs);
    std::__cxx11::string::~string((string *)&xml);
    std::__cxx11::string::string
              ((string *)&xml,"CMAKE_CODEBLOCKS_MAKE_ARGUMENTS",(allocator *)&allFiles);
    pcVar11 = cmMakefile::GetSafeDefinition(mf,(string *)&xml);
    std::__cxx11::string::string((string *)&makeArgs,pcVar11,(allocator *)&fastTarget);
    std::__cxx11::string::~string((string *)&xml);
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fout,0);
    cmXMLWriter::StartDocument(&xml,"UTF-8");
    std::__cxx11::string::string
              ((string *)&allFiles,"CodeBlocks_project_file",(allocator *)&fastTarget);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::string((string *)&allFiles,"FileVersion",(allocator *)&fastTarget);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    allFiles._M_t._M_impl._0_4_ = 1;
    cmXMLWriter::Attribute<int>(&xml,"major",(int *)&allFiles);
    allFiles._M_t._M_impl._0_4_ = 6;
    cmXMLWriter::Attribute<int>(&xml,"minor",(int *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    std::__cxx11::string::string((string *)&allFiles,"Project",(allocator *)&fastTarget);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::string((string *)&allFiles,"Option",(allocator *)&fastTarget);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)&allFiles,
               *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (&xml,"title",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    std::__cxx11::string::string((string *)&allFiles,"Option",(allocator *)&fastTarget);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    allFiles._M_t._M_impl._0_4_ = 1;
    cmXMLWriter::Attribute<int>(&xml,"makefile_is_custom",(int *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    std::__cxx11::string::string((string *)&allFiles,"Option",(allocator *)&fastTarget);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"compiler",&compiler);
    cmXMLWriter::EndElement(&xml);
    Tree::BuildVirtualFolder(&tree,&xml);
    std::__cxx11::string::string((string *)&allFiles,"Build",(allocator *)&fastTarget);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::string((string *)&allFiles,"all",(allocator *)&fastTarget);
    AppendTarget(this,&xml,(string *)&allFiles,(cmGeneratorTarget *)0x0,make._M_dataplus._M_p,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,compiler._M_dataplus._M_p,&makeArgs);
    std::__cxx11::string::~string((string *)&allFiles);
    for (ppcVar14 = (lgs->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        ppcVar14 !=
        (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppcVar14 = ppcVar14 + 1) {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&targets,&(*ppcVar14)->GeneratorTargets);
      for (ppcVar17 = targets.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppcVar17 !=
          targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppcVar17 = ppcVar17 + 1) {
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar17);
        std::__cxx11::string::string((string *)&allFiles,(string *)psVar8);
        TVar5 = cmGeneratorTarget::GetType(*ppcVar17);
        if (TVar5 < UTILITY) {
          pcVar1 = *ppcVar17;
          AppendTarget(this,&xml,(string *)&allFiles,pcVar1,make._M_dataplus._M_p,*ppcVar14,
                       compiler._M_dataplus._M_p,&makeArgs);
          std::__cxx11::string::string((string *)&fastTarget,(string *)&allFiles);
          std::__cxx11::string::append((char *)&fastTarget);
          AppendTarget(this,&xml,&fastTarget,pcVar1,make._M_dataplus._M_p,*ppcVar14,
                       compiler._M_dataplus._M_p,&makeArgs);
          std::__cxx11::string::~string((string *)&fastTarget);
        }
        else if (TVar5 == UTILITY) {
          lVar9 = std::__cxx11::string::find((char *)&allFiles,0x5b3072);
          if ((((lVar9 != 0) ||
               (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&allFiles,"Nightly"), !bVar3)) &&
              ((lVar9 = std::__cxx11::string::find((char *)&allFiles,0x5b2f6e), lVar9 != 0 ||
               (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&allFiles,"Continuous"), !bVar3)))) &&
             ((lVar9 = std::__cxx11::string::find((char *)&allFiles,0x5b2fed), lVar9 != 0 ||
              (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&allFiles,"Experimental"), !bVar3)))) {
LAB_00440f8c:
            AppendTarget(this,&xml,(string *)&allFiles,(cmGeneratorTarget *)0x0,
                         make._M_dataplus._M_p,*ppcVar14,compiler._M_dataplus._M_p,&makeArgs);
          }
        }
        else if (TVar5 == GLOBAL_TARGET) {
          pcVar11 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar14);
          __s2 = cmLocalGenerator::GetBinaryDirectory(*ppcVar14);
          iVar6 = strcmp(pcVar11,__s2);
          if (iVar6 == 0) goto LAB_00440f8c;
        }
        std::__cxx11::string::~string((string *)&allFiles);
      }
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                (&targets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
    }
    cmXMLWriter::EndElement(&xml);
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &allFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pcVar2 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (ppcVar14 = (lgs->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        ppcVar14 !=
        (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppcVar14 = ppcVar14 + 1) {
      this_00 = (*ppcVar14)->Makefile;
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&targets_1,&(*ppcVar14)->GeneratorTargets);
      for (ppcVar17 = targets_1.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppcVar17 !=
          targets_1.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppcVar17 = ppcVar17 + 1) {
        TVar5 = cmGeneratorTarget::GetType(*ppcVar17);
        if (TVar5 < GLOBAL_TARGET) {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pcVar1 = *ppcVar17;
          std::__cxx11::string::string((string *)&targets,"CMAKE_BUILD_TYPE",&local_449);
          pcVar11 = cmMakefile::GetSafeDefinition(this_00,(string *)&targets);
          std::__cxx11::string::string((string *)&fastTarget,pcVar11,&local_44a);
          cmGeneratorTarget::GetSourceFiles(pcVar1,&sources,&fastTarget);
          std::__cxx11::string::~string((string *)&fastTarget);
          std::__cxx11::string::~string((string *)&targets);
          for (ppcVar19 = sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              ppcVar19 !=
              sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppcVar19 = ppcVar19 + 1) {
            TVar5 = cmGeneratorTarget::GetType(pcVar1);
            if (TVar5 == UTILITY) {
              this_01 = *ppcVar19;
              std::__cxx11::string::string((string *)&fastTarget,"GENERATED",(allocator *)&targets);
              bVar3 = cmSourceFile::GetPropertyAsBool(this_01,&fastTarget);
              std::__cxx11::string::~string((string *)&fastTarget);
              if (!bVar3) goto LAB_00441173;
            }
            else {
LAB_00441173:
              cmSourceFile::GetLanguage_abi_cxx11_(&fastTarget,*ppcVar19);
              bVar3 = std::operator==(&fastTarget,"C");
              if ((bVar3) || (bVar3 = std::operator==(&fastTarget,"CXX"), bVar3)) {
                psVar8 = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar19);
                pbVar18 = (pcVar2->SourceFileExtensions).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  bVar21 = pbVar18 ==
                           (pcVar2->SourceFileExtensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  bVar3 = !bVar21;
                  if (bVar21) break;
                  _Var4 = std::operator==(psVar8,pbVar18);
                  pbVar18 = pbVar18 + 1;
                } while (!_Var4);
              }
              else {
                bVar3 = false;
              }
              psVar8 = cmSourceFile::GetFullPath(*ppcVar19,(string *)0x0);
              if (bVar3) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&cFiles,psVar8);
              }
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                        ::operator[](&allFiles,psVar8);
              std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              push_back(&pmVar12->Targets,ppcVar17);
              std::__cxx11::string::~string((string *)&fastTarget);
            }
          }
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
        }
      }
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                (&targets_1.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
    }
    pcVar2 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
    for (pbVar18 = cFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar18 !=
        cFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar18 = pbVar18 + 1) {
      cmsys::SystemTools::GetFilenamePath(&fastTarget,pbVar18);
      std::__cxx11::string::append((char *)&fastTarget);
      cmsys::SystemTools::GetFilenameWithoutExtension((string *)&targets,pbVar18);
      std::__cxx11::string::append((string *)&fastTarget);
      std::__cxx11::string::~string((string *)&targets);
      for (pbVar20 = (pcVar2->HeaderFileExtensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar20 !=
          (pcVar2->HeaderFileExtensions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar20 = pbVar20 + 1) {
        std::__cxx11::string::string((string *)&targets,(string *)&fastTarget);
        std::__cxx11::string::append((char *)&targets);
        std::__cxx11::string::append((string *)&targets);
        iVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                 ::find(&allFiles._M_t,(string *)&targets);
        if ((_Rb_tree_header *)iVar13._M_node != &allFiles._M_t._M_impl.super__Rb_tree_header) {
LAB_00441358:
          std::__cxx11::string::~string((string *)&targets);
          break;
        }
        bVar3 = cmsys::SystemTools::FileExists
                          ((char *)targets.
                                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (bVar3) {
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    ::operator[](&allFiles,pbVar18);
          this_03 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    ::operator[](&allFiles,(string *)&targets);
          std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
          operator=(&this_03->Targets,&pmVar12->Targets);
          goto LAB_00441358;
        }
        std::__cxx11::string::~string((string *)&targets);
      }
      std::__cxx11::string::~string((string *)&fastTarget);
    }
    for (p_Var10 = allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &allFiles._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      std::__cxx11::string::string((string *)&fastTarget,"Unit",(allocator *)&targets);
      cmXMLWriter::StartElement(&xml,&fastTarget);
      std::__cxx11::string::~string((string *)&fastTarget);
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xml,"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var10 + 1))
      ;
      for (p_Var15 = *(_Base_ptr *)(p_Var10 + 2); p_Var15 != p_Var10[2]._M_parent;
          p_Var15 = (_Base_ptr)&p_Var15->_M_parent) {
        std::__cxx11::string::string((string *)&fastTarget,"Option",(allocator *)&targets);
        cmXMLWriter::StartElement(&xml,&fastTarget);
        std::__cxx11::string::~string((string *)&fastTarget);
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)p_Var15);
        cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"target",psVar8);
        cmXMLWriter::EndElement(&xml);
      }
      cmXMLWriter::EndElement(&xml);
    }
    pcVar11 = cmMakefile::GetHomeDirectory(mf);
    std::__cxx11::string::string((string *)&targets,pcVar11,(allocator *)&targets_1);
    std::operator+(&fastTarget,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,"/"
                  );
    Tree::BuildUnit(&tree,&xml,&fastTarget);
    std::__cxx11::string::~string((string *)&fastTarget);
    std::__cxx11::string::~string((string *)&targets);
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndDocument(&xml);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cFiles);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree(&allFiles._M_t);
    cmXMLWriter::~cmXMLWriter(&xml);
    std::__cxx11::string::~string((string *)&makeArgs);
    std::__cxx11::string::~string((string *)&make);
    std::__cxx11::string::~string((string *)&compiler);
    Tree::~Tree(&tree);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  Tree tree;

  // build tree of virtual folders
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
         it = this->GlobalGenerator->GetProjectMap().begin();
       it != this->GlobalGenerator->GetProjectMap().end(); ++it) {
    // Collect all files
    std::vector<std::string> listFiles;
    for (std::vector<cmLocalGenerator*>::const_iterator jt =
           it->second.begin();
         jt != it->second.end(); ++jt) {
      const std::vector<std::string>& files =
        (*jt)->GetMakefile()->GetListFiles();
      listFiles.insert(listFiles.end(), files.begin(), files.end());
    }

    // Convert
    for (std::vector<std::string>::const_iterator jt = listFiles.begin();
         jt != listFiles.end(); ++jt) {
      // don't put cmake's own files into the project (#12110):
      if (jt->find(cmSystemTools::GetCMakeRoot()) == 0) {
        continue;
      }

      const std::string& relative = cmSystemTools::RelativePath(
        it->second[0]->GetSourceDirectory(), jt->c_str());
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end() - 1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      if (!splitted.empty() &&
          relative.find("CMakeFiles") == std::string::npos) {
        tree.InsertPath(splitted, 1, fileName);
      }
    }
  }

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_MAKE_ARGUMENTS");

  cmXMLWriter xml(fout);
  xml.StartDocument();
  xml.StartElement("CodeBlocks_project_file");

  xml.StartElement("FileVersion");
  xml.Attribute("major", 1);
  xml.Attribute("minor", 6);
  xml.EndElement();

  xml.StartElement("Project");

  xml.StartElement("Option");
  xml.Attribute("title", lgs[0]->GetProjectName());
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("makefile_is_custom", 1);
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("compiler", compiler);
  xml.EndElement();

  // Now build a virtual tree
  tree.BuildVirtualFolder(xml);

  xml.StartElement("Build");

  this->AppendTarget(xml, "all", CM_NULLPTR, make.c_str(), lgs[0],
                     compiler.c_str(), makeArgs);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg = lgs.begin();
       lg != lgs.end(); lg++) {
    std::vector<cmGeneratorTarget*> targets = (*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++) {
      std::string targetName = (*ti)->GetName();
      switch ((*ti)->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp((*lg)->GetCurrentBinaryDirectory(),
                     (*lg)->GetBinaryDirectory()) == 0) {
            this->AppendTarget(xml, targetName, CM_NULLPTR, make.c_str(), *lg,
                               compiler.c_str(), makeArgs);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(xml, targetName, CM_NULLPTR, make.c_str(), *lg,
                             compiler.c_str(), makeArgs);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          cmGeneratorTarget* gt = *ti;
          this->AppendTarget(xml, targetName, gt, make.c_str(), *lg,
                             compiler.c_str(), makeArgs);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(xml, fastTarget, gt, make.c_str(), *lg,
                             compiler.c_str(), makeArgs);
        } break;
        default:
          break;
      }
    }
  }

  xml.EndElement(); // Build

  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an acompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  std::vector<std::string> const& srcExts =
    this->GlobalGenerator->GetCMakeInstance()->GetSourceExtensions();

  for (std::vector<cmLocalGenerator*>::const_iterator lg = lgs.begin();
       lg != lgs.end(); lg++) {
    cmMakefile* makefile = (*lg)->GetMakefile();
    std::vector<cmGeneratorTarget*> targets = (*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++) {
      switch ((*ti)->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
        case cmStateEnums::UTILITY: // can have sources since 2.6.3
        {
          std::vector<cmSourceFile*> sources;
          cmGeneratorTarget* gt = *ti;
          gt->GetSourceFiles(sources,
                             makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si = sources.begin();
               si != sources.end(); si++) {
            // don't add source files from UTILITY target which have the
            // GENERATED property set:
            if (gt->GetType() == cmStateEnums::UTILITY &&
                (*si)->GetPropertyAsBool("GENERATED")) {
              continue;
            }

            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX") {
              std::string const& srcext = (*si)->GetExtension();
              for (std::vector<std::string>::const_iterator ext =
                     srcExts.begin();
                   ext != srcExts.end(); ++ext) {
                if (srcext == *ext) {
                  isCFile = true;
                  break;
                }
              }
            }

            std::string const& fullPath = (*si)->GetFullPath();

            if (isCFile) {
              cFiles.push_back(fullPath);
            }

            CbpUnit& cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(*ti);
          }
        }
        default: // intended fallthrough
          break;
      }
    }
  }

  std::vector<std::string> const& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::vector<std::string>::const_iterator sit = cFiles.begin();
       sit != cFiles.end(); ++sit) {
    std::string const& fileName = *sit;
    std::string headerBasename = cmSystemTools::GetFilenamePath(fileName);
    headerBasename += "/";
    headerBasename += cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for (std::vector<std::string>::const_iterator ext = headerExts.begin();
         ext != headerExts.end(); ++ext) {
      std::string hname = headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname.c_str())) {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
      }
    }
  }

  // insert all source files in the CodeBlocks project
  for (all_files_map_t::const_iterator sit = allFiles.begin();
       sit != allFiles.end(); ++sit) {
    std::string const& unitFilename = sit->first;
    CbpUnit const& unit = sit->second;

    xml.StartElement("Unit");
    xml.Attribute("filename", unitFilename);

    for (std::vector<const cmGeneratorTarget*>::const_iterator ti =
           unit.Targets.begin();
         ti != unit.Targets.end(); ++ti) {
      xml.StartElement("Option");
      xml.Attribute("target", (*ti)->GetName());
      xml.EndElement();
    }

    xml.EndElement();
  }

  // Add CMakeLists.txt
  tree.BuildUnit(xml, std::string(mf->GetHomeDirectory()) + "/");

  xml.EndElement(); // Project
  xml.EndElement(); // CodeBlocks_project_file
  xml.EndDocument();
}